

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O2

uint32 rw::gl3::getSizeNativeTexture(Texture *tex)

{
  int32 iVar1;
  uint32 uVar2;
  int32 extraout_EDX;
  int32 level;
  int32 extraout_EDX_00;
  Raster *raster;
  uint32 uVar3;
  
  iVar1 = Raster::getNumLevels(tex->raster);
  raster = (Raster *)0x0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  uVar3 = 0x74;
  level = extraout_EDX;
  while( true ) {
    if (iVar1 == (int)raster) break;
    uVar2 = getLevelSize((gl3 *)tex->raster,raster,level);
    uVar3 = uVar3 + uVar2 + 4;
    raster = (Raster *)(ulong)((int)raster + 1);
    level = extraout_EDX_00;
  }
  return uVar3;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 32;
	int32 levels = tex->raster->getNumLevels();
	for(int32 i = 0; i < levels; i++)
		size += 4 + getLevelSize(tex->raster, i);
	return size;
}